

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float fVar1;
  double dVar2;
  ClassNameResolver *this_00;
  bool bVar3;
  CppType CVar4;
  int32_t i32;
  uint32_t i32_00;
  Type TVar5;
  int64_t i64;
  uint64_t i64_00;
  char *pcVar6;
  string *psVar7;
  EnumDescriptor *descriptor;
  EnumValueDescriptor *this_01;
  Descriptor *descriptor_00;
  LogMessage *other;
  undefined7 in_register_00000009;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  allocator local_6ca;
  LogFinisher local_6c9;
  LogMessage local_6c8;
  string local_690;
  string local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  SubstituteArg local_630;
  SubstituteArg local_600;
  SubstituteArg local_5d0;
  SubstituteArg local_5a0;
  SubstituteArg local_570;
  SubstituteArg local_540;
  SubstituteArg local_510;
  SubstituteArg local_4e0;
  SubstituteArg local_4b0;
  string local_480;
  SubstituteArg local_460;
  allocator local_429;
  string local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator local_3c1;
  SubstituteArg local_3c0;
  SubstituteArg local_390;
  SubstituteArg local_360;
  SubstituteArg local_330;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  string local_210;
  SubstituteArg local_1f0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_16f;
  allocator local_16e;
  allocator local_16d;
  float local_16c;
  undefined1 local_168 [4];
  float value_1;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  double local_140;
  double value;
  string local_108;
  AlphaNum local_d8;
  string local_a8;
  AlphaNum local_88;
  AlphaNum local_58;
  ClassNameResolver *local_28;
  ClassNameResolver *name_resolver_local;
  java *pjStack_18;
  bool immutable_local;
  FieldDescriptor *field_local;
  
  local_28 = (ClassNameResolver *)CONCAT71(in_register_00000009,immutable);
  name_resolver_local._7_1_ = (byte)field & 1;
  pjStack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  this_00 = local_28;
  switch(CVar4) {
  case CPPTYPE_INT32:
    i32 = FieldDescriptor::default_value_int32((FieldDescriptor *)pjStack_18);
    strings::AlphaNum::AlphaNum(&local_58,i32);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_58,a);
    break;
  case CPPTYPE_INT64:
    i64 = FieldDescriptor::default_value_int64((FieldDescriptor *)pjStack_18);
    strings::AlphaNum::AlphaNum(&local_d8,i64);
    StrCat_abi_cxx11_(&local_a8,(protobuf *)&local_d8,a_01);
    std::operator+(__return_storage_ptr__,&local_a8,"L");
    std::__cxx11::string::~string((string *)&local_a8);
    break;
  case CPPTYPE_UINT32:
    i32_00 = FieldDescriptor::default_value_uint32((FieldDescriptor *)pjStack_18);
    strings::AlphaNum::AlphaNum(&local_88,i32_00);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_88,a_00);
    break;
  case CPPTYPE_UINT64:
    i64_00 = FieldDescriptor::default_value_uint64((FieldDescriptor *)pjStack_18);
    strings::AlphaNum::AlphaNum((AlphaNum *)&value,i64_00);
    StrCat_abi_cxx11_(&local_108,(protobuf *)&value,a_02);
    std::operator+(__return_storage_ptr__,&local_108,"L");
    std::__cxx11::string::~string((string *)&local_108);
    break;
  case CPPTYPE_DOUBLE:
    dVar10 = FieldDescriptor::default_value_double((FieldDescriptor *)pjStack_18);
    local_140 = dVar10;
    dVar11 = std::numeric_limits<double>::infinity();
    dVar2 = local_140;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar10 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar10) || (NAN(dVar2) || NAN(-dVar10))) {
        if (NAN(local_140)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"Double.NaN",&local_143);
          std::allocator<char>::~allocator((allocator<char> *)&local_143);
        }
        else {
          SimpleDtoa_abi_cxx11_((string *)local_168,(protobuf *)this,local_140);
          std::operator+(__return_storage_ptr__,(string *)local_168,"D");
          std::__cxx11::string::~string((string *)local_168);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"Double.NEGATIVE_INFINITY",&local_142);
        std::allocator<char>::~allocator((allocator<char> *)&local_142);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Double.POSITIVE_INFINITY",&local_141);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar8 = FieldDescriptor::default_value_float((FieldDescriptor *)pjStack_18);
    local_16c = fVar8;
    fVar9 = std::numeric_limits<float>::infinity();
    fVar1 = local_16c;
    if ((fVar8 != fVar9) || (NAN(fVar8) || NAN(fVar9))) {
      fVar8 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar8) || (NAN(fVar1) || NAN(-fVar8))) {
        if (NAN(local_16c)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"Float.NaN",&local_16f);
          std::allocator<char>::~allocator((allocator<char> *)&local_16f);
        }
        else {
          SimpleFtoa_abi_cxx11_(&local_190,(protobuf *)this,local_16c);
          std::operator+(__return_storage_ptr__,&local_190,"F");
          std::__cxx11::string::~string((string *)&local_190);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"Float.NEGATIVE_INFINITY",&local_16e);
        std::allocator<char>::~allocator((allocator<char> *)&local_16e);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Float.POSITIVE_INFINITY",&local_16d);
      std::allocator<char>::~allocator((allocator<char> *)&local_16d);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool((FieldDescriptor *)pjStack_18);
    pcVar6 = "false";
    if (bVar3) {
      pcVar6 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,&local_191);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    break;
  case CPPTYPE_ENUM:
    descriptor = FieldDescriptor::enum_type((FieldDescriptor *)pjStack_18);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_670,this_00,descriptor,(bool)(name_resolver_local._7_1_ & 1));
    std::operator+(&local_650,&local_670,".");
    this_01 = FieldDescriptor::default_value_enum((FieldDescriptor *)pjStack_18);
    psVar7 = EnumValueDescriptor::name_abi_cxx11_(this_01);
    std::operator+(__return_storage_ptr__,&local_650,psVar7);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_670);
    break;
  case CPPTYPE_STRING:
    TVar5 = GetType((FieldDescriptor *)pjStack_18);
    if (TVar5 == TYPE_BYTES) {
      bVar3 = FieldDescriptor::has_default_value((FieldDescriptor *)pjStack_18);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b8,"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                   &local_1b9);
        psVar7 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_210,psVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_1f0,&local_210);
        strings::internal::SubstituteArg::SubstituteArg(&local_240);
        strings::internal::SubstituteArg::SubstituteArg(&local_270);
        strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_2d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_300);
        strings::internal::SubstituteArg::SubstituteArg(&local_330);
        strings::internal::SubstituteArg::SubstituteArg(&local_360);
        strings::internal::SubstituteArg::SubstituteArg(&local_390);
        strings::internal::SubstituteArg::SubstituteArg(&local_3c0);
        strings::Substitute(__return_storage_ptr__,&local_1b8,&local_1f0,&local_240,&local_270,
                            &local_2a0,&local_2d0,&local_300,&local_330,&local_360,&local_390,
                            &local_3c0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"com.google.protobuf.ByteString.EMPTY",
                   &local_3c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      }
    }
    else {
      psVar7 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
      bVar3 = AllAscii(psVar7);
      if (bVar3) {
        psVar7 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_408,psVar7);
        std::operator+(&local_3e8,"\"",&local_408);
        std::operator+(__return_storage_ptr__,&local_3e8,"\"");
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_428,"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                   &local_429);
        psVar7 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_480,psVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_460,&local_480);
        strings::internal::SubstituteArg::SubstituteArg(&local_4b0);
        strings::internal::SubstituteArg::SubstituteArg(&local_4e0);
        strings::internal::SubstituteArg::SubstituteArg(&local_510);
        strings::internal::SubstituteArg::SubstituteArg(&local_540);
        strings::internal::SubstituteArg::SubstituteArg(&local_570);
        strings::internal::SubstituteArg::SubstituteArg(&local_5a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_5d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_600);
        strings::internal::SubstituteArg::SubstituteArg(&local_630);
        strings::Substitute(__return_storage_ptr__,&local_428,&local_460,&local_4b0,&local_4e0,
                            &local_510,&local_540,&local_570,&local_5a0,&local_5d0,&local_600,
                            &local_630);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_428);
        std::allocator<char>::~allocator((allocator<char> *)&local_429);
      }
    }
    break;
  case CPPTYPE_MESSAGE:
    descriptor_00 = FieldDescriptor::message_type((FieldDescriptor *)pjStack_18);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_690,this_00,descriptor_00,(bool)(name_resolver_local._7_1_ & 1));
    std::operator+(__return_storage_ptr__,&local_690,".getDefaultInstance()");
    std::__cxx11::string::~string((string *)&local_690);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_6c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x285);
    other = internal::LogMessage::operator<<(&local_6c8,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_6c9,other);
    internal::LogMessage::~LogMessage(&local_6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_6ca);
    std::allocator<char>::~allocator((allocator<char> *)&local_6ca);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return StrCat(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
             field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
             ".getDefaultInstance()";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}